

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

char * Diligent::Parsing::SkipLine<char_const*>(char **Start,char **End,bool GoToNextLine)

{
  bool bVar1;
  char *pcVar2;
  byte local_29;
  char *local_28;
  char *Pos;
  bool GoToNextLine_local;
  char **End_local;
  char **Start_local;
  
  local_28 = *Start;
  while( true ) {
    local_29 = 0;
    if ((local_28 != *End) && (local_29 = 0, *local_28 != '\0')) {
      bVar1 = IsNewLine(*local_28);
      local_29 = bVar1 ^ 0xff;
    }
    if ((local_29 & 1) == 0) break;
    local_28 = local_28 + 1;
  }
  pcVar2 = local_28;
  if ((((GoToNextLine) && (local_28 != *End)) && (bVar1 = IsNewLine(*local_28), bVar1)) &&
     (((pcVar2 = local_28 + 1, *local_28 == '\r' && (pcVar2 != *End)) && (*pcVar2 == '\n')))) {
    pcVar2 = local_28 + 2;
  }
  local_28 = pcVar2;
  return local_28;
}

Assistant:

InteratorType SkipLine(const InteratorType& Start, const InteratorType& End, bool GoToNextLine = false) noexcept
{
    auto Pos = Start;
    while (Pos != End && *Pos != '\0' && !IsNewLine(*Pos))
        ++Pos;
    if (GoToNextLine && Pos != End && IsNewLine(*Pos))
    {
        ++Pos;
        if (Pos[-1] == '\r' && Pos != End && Pos[0] == '\n')
        {
            ++Pos;
            // treat \r\n as a single ending
        }
    }
    return Pos;
}